

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O0

void __thiscall AMorphProjectile::Serialize(AMorphProjectile *this,FSerializer *arc)

{
  AActor *pAVar1;
  FSerializer *pFVar2;
  AMorphProjectile *def;
  FSerializer *arc_local;
  AMorphProjectile *this_local;
  
  AActor::Serialize(&this->super_AActor,arc);
  pAVar1 = AActor::GetDefault(&this->super_AActor);
  pFVar2 = FSerializer::operator()
                     (arc,"playerclass",&this->PlayerClass,(PClassPlayerPawn **)(pAVar1 + 1));
  pFVar2 = FSerializer::operator()
                     (pFVar2,"monsterclass",&this->MonsterClass,
                      (PClassActor **)&pAVar1[1].super_DThinker.super_DObject.Class);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"duration",&this->Duration,
                      (int *)&pAVar1[1].super_DThinker.super_DObject.ObjectFlags);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"morphstyle",&this->MorphStyle,
                      (int *)&pAVar1[1].super_DThinker.super_DObject.field_0x24);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"morphflash",&this->MorphFlash,
                      (PClassActor **)&pAVar1[1].super_DThinker.super_DObject.ObjNext);
  FSerializer::operator()
            (pFVar2,"unmorphflash",&this->UnMorphFlash,
             (PClassActor **)&pAVar1[1].super_DThinker.super_DObject.GCNext);
  return;
}

Assistant:

void AMorphProjectile::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (AMorphProjectile*)GetDefault();
	arc("playerclass", PlayerClass, def->PlayerClass)
		("monsterclass", MonsterClass, def->MonsterClass)
		("duration", Duration, def->Duration)
		("morphstyle", MorphStyle, def->MorphStyle)
		("morphflash", MorphFlash, def->MorphFlash)
		("unmorphflash", UnMorphFlash, def->UnMorphFlash);
}